

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O0

DecodeStatus DecodeL2OpInstructionFail(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint Opcode;
  void *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  uVar1 = fieldFromInstruction_4(Insn,0x10,4);
  uVar2 = fieldFromInstruction_4(Insn,0x1b,5);
  uVar3 = uVar1 | uVar2 << 4;
  if (uVar3 == 0xc) {
    MCInst_setOpcode(Inst,0xe5);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x1c) {
    MCInst_setOpcode(Inst,0xf2);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x2c) {
    MCInst_setOpcode(Inst,0x1b);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x3c) {
    MCInst_setOpcode(Inst,0x8e);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x4c) {
    MCInst_setOpcode(Inst,0x87);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x5c) {
    MCInst_setOpcode(Inst,0x80);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x6c) {
    MCInst_setOpcode(Inst,0x7f);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x7c) {
    MCInst_setOpcode(Inst,0xad);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x8c) {
    MCInst_setOpcode(Inst,0x45);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x9c) {
    MCInst_setOpcode(Inst,0x46);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x10c) {
    MCInst_setOpcode(Inst,0xd9);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x11c) {
    MCInst_setOpcode(Inst,0xda);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 300) {
    MCInst_setOpcode(Inst,0x1a);
    Inst_local._4_4_ = DecodeL2RUSBitpInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x12d) {
    MCInst_setOpcode(Inst,0xb3);
    Inst_local._4_4_ = DecodeL2RUSBitpInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x12e) {
    MCInst_setOpcode(Inst,0x6f);
    Inst_local._4_4_ = DecodeL2RUSBitpInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x13c) {
    MCInst_setOpcode(Inst,0x8d);
    Inst_local._4_4_ = DecodeL2RUSInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x14c) {
    MCInst_setOpcode(Inst,0x86);
    Inst_local._4_4_ = DecodeL2RUSInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x15c) {
    MCInst_setOpcode(Inst,0x41);
    Inst_local._4_4_ = DecodeL3RSrcDstInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x18c) {
    MCInst_setOpcode(Inst,0xb8);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else if (uVar3 == 0x19c) {
    MCInst_setOpcode(Inst,0xb9);
    Inst_local._4_4_ = DecodeL3RInstruction(Inst,Insn,Address,Decoder);
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeL2OpInstructionFail(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	// Try and decode as a L3R / L2RUS instruction.
	unsigned Opcode = fieldFromInstruction_4(Insn, 16, 4) |
		fieldFromInstruction_4(Insn, 27, 5) << 4;
	switch (Opcode) {
		case 0x0c:
			MCInst_setOpcode(Inst, XCore_STW_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x1c:
			MCInst_setOpcode(Inst, XCore_XOR_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x2c:
			MCInst_setOpcode(Inst, XCore_ASHR_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x3c:
			MCInst_setOpcode(Inst, XCore_LDAWF_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x4c:
			MCInst_setOpcode(Inst, XCore_LDAWB_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x5c:
			MCInst_setOpcode(Inst, XCore_LDA16F_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x6c:
			MCInst_setOpcode(Inst, XCore_LDA16B_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x7c:
			MCInst_setOpcode(Inst, XCore_MUL_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x8c:
			MCInst_setOpcode(Inst, XCore_DIVS_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x9c:
			MCInst_setOpcode(Inst, XCore_DIVU_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x10c:
			MCInst_setOpcode(Inst, XCore_ST16_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x11c:
			MCInst_setOpcode(Inst, XCore_ST8_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x12c:
			MCInst_setOpcode(Inst, XCore_ASHR_l2rus);
			return DecodeL2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x12d:
			MCInst_setOpcode(Inst, XCore_OUTPW_l2rus);
			return DecodeL2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x12e:
			MCInst_setOpcode(Inst, XCore_INPW_l2rus);
			return DecodeL2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x13c:
			MCInst_setOpcode(Inst, XCore_LDAWF_l2rus);
			return DecodeL2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x14c:
			MCInst_setOpcode(Inst, XCore_LDAWB_l2rus);
			return DecodeL2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x15c:
			MCInst_setOpcode(Inst, XCore_CRC_l3r);
			return DecodeL3RSrcDstInstruction(Inst, Insn, Address, Decoder);
		case 0x18c:
			MCInst_setOpcode(Inst, XCore_REMS_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
		case 0x19c:
			MCInst_setOpcode(Inst, XCore_REMU_l3r);
			return DecodeL3RInstruction(Inst, Insn, Address, Decoder);
	}

	return MCDisassembler_Fail;
}